

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O1

string * helics::brokerStateName_abi_cxx11_(BrokerState state)

{
  int iVar1;
  string *psVar2;
  
  if (brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::createdString_abi_cxx11_ == '\0')
  {
    iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                 createdString_abi_cxx11_);
    if (iVar1 != 0) {
      brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::createdString_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                     createdString_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  createdString_abi_cxx11_,"created","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                    createdString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                           createdString_abi_cxx11_);
    }
  }
  if (brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::configuringString_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                 configuringString_abi_cxx11_);
    if (iVar1 != 0) {
      brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::configuringString_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                     configuringString_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  configuringString_abi_cxx11_,"configuring","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                    configuringString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                           configuringString_abi_cxx11_);
    }
  }
  if (brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::configuredString_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                 configuredString_abi_cxx11_);
    if (iVar1 != 0) {
      brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::configuredString_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                     configuredString_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  configuredString_abi_cxx11_,"configured","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                    configuredString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                           configuredString_abi_cxx11_);
    }
  }
  if (brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::connectingString_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                 connectingString_abi_cxx11_);
    if (iVar1 != 0) {
      brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::connectingString_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                     connectingString_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  connectingString_abi_cxx11_,"connecting","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                    connectingString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                           connectingString_abi_cxx11_);
    }
  }
  if (brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::connectedString_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                 connectedString_abi_cxx11_);
    if (iVar1 != 0) {
      brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::connectedString_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                     connectedString_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  connectedString_abi_cxx11_,"connected","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                    connectedString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                           connectedString_abi_cxx11_);
    }
  }
  if (brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::initializingString_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                 initializingString_abi_cxx11_);
    if (iVar1 != 0) {
      brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::initializingString_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                     initializingString_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  initializingString_abi_cxx11_,"initializing","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                    initializingString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                           initializingString_abi_cxx11_);
    }
  }
  if (brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::operatingString_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                 operatingString_abi_cxx11_);
    if (iVar1 != 0) {
      brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::operatingString_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                     operatingString_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  operatingString_abi_cxx11_,"operating","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                    operatingString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                           operatingString_abi_cxx11_);
    }
  }
  if (brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::terminatingString_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                 terminatingString_abi_cxx11_);
    if (iVar1 != 0) {
      brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::terminatingString_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                     terminatingString_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  terminatingString_abi_cxx11_,"terminating","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                    terminatingString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                           terminatingString_abi_cxx11_);
    }
  }
  if (brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::terminatingErrorString_abi_cxx11_
      == '\0') {
    iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                 terminatingErrorString_abi_cxx11_);
    if (iVar1 != 0) {
      brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::terminatingErrorString_abi_cxx11_
      ._M_dataplus._M_p =
           (pointer)&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                     terminatingErrorString_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  terminatingErrorString_abi_cxx11_,"terminating_error","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                    terminatingErrorString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                           terminatingErrorString_abi_cxx11_);
    }
  }
  if (brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::terminatedString_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                 terminatedString_abi_cxx11_);
    if (iVar1 != 0) {
      brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::terminatedString_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                     terminatedString_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  terminatedString_abi_cxx11_,"terminated","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                    terminatedString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                           terminatedString_abi_cxx11_);
    }
  }
  if (brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::erroredString_abi_cxx11_ == '\0')
  {
    iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                 erroredString_abi_cxx11_);
    if (iVar1 != 0) {
      brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::erroredString_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                     erroredString_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  erroredString_abi_cxx11_,"error","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                    erroredString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                           erroredString_abi_cxx11_);
    }
  }
  if (brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::connectedErrorString_abi_cxx11_
      == '\0') {
    iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                 connectedErrorString_abi_cxx11_);
    if (iVar1 != 0) {
      brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::connectedErrorString_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                     connectedErrorString_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  connectedErrorString_abi_cxx11_,"connected_error","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                    connectedErrorString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                           connectedErrorString_abi_cxx11_);
    }
  }
  if (brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::otherString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                 otherString_abi_cxx11_);
    if (iVar1 != 0) {
      brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::otherString_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                     otherString_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  otherString_abi_cxx11_,"other","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                    otherString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                           otherString_abi_cxx11_);
    }
  }
  if ((ushort)(state + 10) < 0x12) {
    psVar2 = (string *)(&PTR_createdString_abi_cxx11__00563ad8)[(ushort)(state + 10)];
  }
  else {
    psVar2 = &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::otherString_abi_cxx11_;
  }
  return psVar2;
}

Assistant:

const std::string& brokerStateName(BrokerBase::BrokerState state)
{
    static const std::string createdString = "created";
    static const std::string configuringString = "configuring";
    static const std::string configuredString = "configured";
    static const std::string connectingString = "connecting";
    static const std::string connectedString = "connected";
    static const std::string initializingString = "initializing";
    static const std::string operatingString = "operating";
    static const std::string terminatingString = "terminating";
    static const std::string terminatingErrorString = "terminating_error";
    static const std::string terminatedString = "terminated";
    static const std::string erroredString = "error";
    static const std::string connectedErrorString = "connected_error";
    static const std::string otherString = "other";
    switch (state) {
        case BrokerBase::BrokerState::CREATED:
            return createdString;
        case BrokerBase::BrokerState::CONFIGURING:
            return configuringString;
        case BrokerBase::BrokerState::CONFIGURED:
            return configuredString;
        case BrokerBase::BrokerState::CONNECTING:
            return connectingString;
        case BrokerBase::BrokerState::CONNECTED:
            return connectedString;
        case BrokerBase::BrokerState::INITIALIZING:
            return initializingString;
        case BrokerBase::BrokerState::OPERATING:
            return operatingString;
        case BrokerBase::BrokerState::TERMINATING:
            return terminatingString;
        case BrokerBase::BrokerState::TERMINATING_ERROR:
            return terminatingErrorString;
        case BrokerBase::BrokerState::TERMINATED:
            return terminatedString;
        case BrokerBase::BrokerState::ERRORED:
            return erroredString;
        case BrokerBase::BrokerState::CONNECTED_ERROR:
            return connectedErrorString;
        default:
            return otherString;
    }
}